

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u64 sqlite3LogEstToInt(LogEst x)

{
  long lVar1;
  char cVar2;
  ushort uVar3;
  
  uVar3 = x % 10;
  if (0x261 < x) {
    return 0x7fffffffffffffff;
  }
  lVar1 = 0;
  if (uVar3 != 0) {
    lVar1 = (long)(short)uVar3 + -1;
  }
  if (4 < uVar3) {
    lVar1 = (long)(short)uVar3 + -2;
  }
  cVar2 = (char)(x / 10);
  if (0x1d < x) {
    return lVar1 + 8U << (cVar2 - 3U & 0x3f);
  }
  return lVar1 + 8U >> (3U - cVar2 & 0x3f);
}

Assistant:

SQLITE_PRIVATE u64 sqlite3LogEstToInt(LogEst x){
  u64 n;
  n = x%10;
  x /= 10;
  if( n>=5 ) n -= 2;
  else if( n>=1 ) n -= 1;
  if( x>60 ) return (u64)LARGEST_INT64;
  return x>=3 ? (n+8)<<(x-3) : (n+8)>>(3-x);
}